

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_dual.cpp
# Opt level: O3

void __thiscall
cppcms::sessions::session_dual::save
          (session_dual *this,session_interface *session,string *data,time_t timeout,bool isnew,
          bool on_server)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined7 in_register_00000089;
  string cookie;
  string local_50;
  
  if (((int)CONCAT71(in_register_00000089,on_server) == 0) &&
     (data->_M_string_length <= this->data_size_limit_)) {
    session_interface::get_session_cookie_abi_cxx11_(&local_50,session);
    if ((local_50._M_string_length != 0) && (*local_50._M_dataplus._M_p == 'I')) {
      peVar1 = (this->server_).
               super___shared_ptr<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar1->super_session_api)._vptr_session_api[2])(peVar1,session);
    }
    peVar2 = (this->client_).
             super___shared_ptr<cppcms::sessions::session_cookies,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (**(peVar2->super_session_api)._vptr_session_api)(peVar2,session,data,timeout,(ulong)isnew,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return;
  }
  peVar1 = (this->server_).
           super___shared_ptr<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(peVar1->super_session_api)._vptr_session_api)(peVar1,session,data,timeout,(ulong)isnew,1);
  return;
}

Assistant:

void session_dual::save(session_interface &session,string const &data,time_t timeout,bool isnew,bool on_server)
{
	if(on_server || data.size() > data_size_limit_) {
		server_->save(session,data,timeout,isnew,true);
	}
	else {
		std::string cookie=session.get_session_cookie();
		if(!cookie.empty() && cookie[0]=='I') {
			server_->clear(session);
		}
		client_->save(session,data,timeout,isnew,false);
	}
}